

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O3

int __thiscall cmCPackArchiveGenerator::InitializeInternal(cmCPackArchiveGenerator *this)

{
  pointer pcVar1;
  cmCPackLog *this_00;
  size_t msg;
  int iVar2;
  cmValue cVar3;
  ostream *poVar4;
  size_t length;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string newExtension;
  ostringstream cmCPackLog_msg;
  long *local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  long local_1f8 [2];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  long *local_1c8;
  undefined8 local_1c0;
  string local_1b8;
  undefined1 local_198 [8];
  long *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_128 [264];
  
  local_198 = (undefined1  [8])local_188;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY","");
  cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,(string *)local_198,"1");
  if (local_198 != (undefined1  [8])local_188) {
    operator_delete((void *)local_198,(ulong)(local_188[0]._M_allocated_capacity + 1));
  }
  local_198 = (undefined1  [8])local_188;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,"CPACK_ARCHIVE_FILE_EXTENSION","");
  cVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_198);
  if (local_198 != (undefined1  [8])local_188) {
    operator_delete((void *)local_198,(ulong)(local_188[0]._M_allocated_capacity + 1));
  }
  if ((cVar3.Value != (string *)0x0) && ((cVar3.Value)->_M_string_length != 0)) {
    pcVar1 = ((cVar3.Value)->_M_dataplus)._M_p;
    local_208 = local_1f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,pcVar1,pcVar1 + (cVar3.Value)->_M_string_length);
    local_198 = (undefined1  [8])local_200;
    local_190 = local_208;
    __str._M_str = ".";
    __str._M_len = 1;
    iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_198,0,1,__str);
    if (iVar2 != 0) {
      local_1e8.first._M_str = local_188[0]._M_local_buf + 8;
      local_198 = (undefined1  [8])0x0;
      local_190 = (long *)0x1;
      local_188[0]._M_local_buf[8] = '.';
      local_1e8.first._M_len = 1;
      local_1e8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_1d0 = local_200;
      local_1c8 = local_208;
      local_1c0 = 0;
      views._M_len = 2;
      views._M_array = &local_1e8;
      local_188[0]._0_8_ = local_1e8.first._M_str;
      cmCatViews(&local_1b8,views);
      std::__cxx11::string::operator=((string *)&local_208,(string *)&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Using user-provided file extension ",0x23);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(char *)local_208,(long)local_200);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," instead of the default ",0x18);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->OutputExtension)._M_dataplus._M_p,
                        (this->OutputExtension)._M_string_length);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    this_00 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    msg = local_1e8.first._M_len;
    length = strlen((char *)local_1e8.first._M_len);
    cmCPackLog::Log(this_00,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0xdf,(char *)msg,length);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_1e8.first._M_len
        != &local_1e8.second) {
      operator_delete((void *)local_1e8.first._M_len,
                      (ulong)((long)&((local_1e8.second)->_M_dataplus)._M_p + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
    std::__cxx11::string::operator=((string *)&this->OutputExtension,(string *)&local_208);
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
  }
  iVar2 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
  return iVar2;
}

Assistant:

int cmCPackArchiveGenerator::InitializeInternal()
{
  this->SetOptionIfNotSet("CPACK_INCLUDE_TOPLEVEL_DIRECTORY", "1");
  cmValue newExtensionValue = this->GetOption("CPACK_ARCHIVE_FILE_EXTENSION");
  if (!newExtensionValue.IsEmpty()) {
    std::string newExtension = *newExtensionValue;
    if (!cmHasLiteralPrefix(newExtension, ".")) {
      newExtension = cmStrCat('.', newExtension);
    }
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Using user-provided file extension "
                    << newExtension << " instead of the default "
                    << this->OutputExtension << std::endl);
    this->OutputExtension = std::move(newExtension);
  }
  return this->Superclass::InitializeInternal();
}